

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall
XipFile::TocEntry::fromstream(TocEntry *this,XipFile *xip,allocmap *m,ReadWriter_ptr *r)

{
  undefined8 *puVar1;
  ReadWriter_ptr *r_local;
  allocmap *m_local;
  XipFile *xip_local;
  TocEntry *this_local;
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "xip module import not supported";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

virtual void fromstream(XipFile& xip, allocmap& m, ReadWriter_ptr r)
        {
            throw "xip module import not supported";
#if 0
            // todo - finish module importer
            exereader exerd;
            exerd.load(r);

            size_t e32size= exe_reconstructor::e32rom::size();
            size_t o32size= exe_reconstructor::o32rom::size();

            // alloc space for e32/o32 headers
            _rvae32= m.findfree(e32size);
            _rvao32= m.findfree(o32size*exerd.nr_o32_sections());
            // alloc space for sections
            for (int i=0 ; i<exerd.nr_o32_sections() ; i++) {
                ByteVector data(roundsize(_exe->o32datasize(i), 4));
                r->setpos(_exe->o32dataptr(i));
                r->read(&data[0], data.size());
                ByteVector compressed(data.size());
                uint32_t compsize= XipFile::compress(&data[0], data.size(), &compressed[0]);

                uint32_t attr= 0;
                const uint8_t *pdata= &compressed[0];
                if (compsize>=data.size() || compsize==0) {
                    compsize= data.size();
                    pdata= &data[0];
                }
                else {
                    attr |= 0x800;   // compressed
                }

                _exe->o32datarva(i, m.findfree(roundsize(compsize, 4)));
                xip.getrvareader(_exe->o32datarva(i), data.size())->write(pdata, compsize);
            }
            ByteVector pehdr(e32size+o32size*exerd.nr_o32_sections());
            _exe->get_pe_data(pehdr);

            xip.getrvareader(_rvae32, e32size)->write(&pehdr[0], e32size);
            xip.getrvareader(_rvao32, o32size*exerd.nr_o32_sections())->write(&pehdr[e32size], o32size*exerd.nr_o32_sections());

#endif
        }